

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_true>::append_edge_(DaTrie<false,_true,_true> *this,Query *query)

{
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  DaTrie<false,_true,_true> *this_00;
  DaTrie<false,_true,_true> *pDVar8;
  reference pvVar9;
  Query *this_01;
  reference pvVar10;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint32_t base;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *this_02;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  
  uVar3 = (uint8_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  uVar4 = Query::node_pos(in_RSI);
  this_00 = (DaTrie<false,_true,_true> *)(ulong)uVar4;
  pDVar8 = (DaTrie<false,_true,_true> *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI)
  ;
  if (pDVar8 <= this_00) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x205,
                  "void ddd::DaTrie<false, true, true>::append_edge_(Query &) [WithBLM = false, WithNLM = true, Prefix = true]"
                 );
  }
  uVar4 = Query::node_pos(in_RSI);
  pvVar9 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
  bVar1 = Bc::is_fixed(pvVar9);
  if (!bVar1) {
    __assert_fail("bc_[query.node_pos()].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x206,
                  "void ddd::DaTrie<false, true, true>::append_edge_(Query &) [WithBLM = false, WithNLM = true, Prefix = true]"
                 );
  }
  Query::label(in_RSI);
  uVar5 = xcheck_((DaTrie<false,_true,_true> *)
                  CONCAT17(in_stack_ffffffffffffffd7,
                           CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),uVar3,
                  in_stack_ffffffffffffffc0);
  uVar4 = uVar5;
  bVar2 = Query::label(in_RSI);
  uVar6 = uVar4 ^ bVar2;
  fix_(this_00,(uint32_t)((ulong)in_RDI >> 0x20),
       (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
       CONCAT17(in_stack_ffffffffffffffd7,
                CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  uVar7 = Query::node_pos(in_RSI);
  pvVar9 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar7);
  Bc::set_base(pvVar9,uVar5);
  this_01 = (Query *)std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar6)
  ;
  uVar5 = Query::node_pos(in_RSI);
  Bc::set_check((Bc *)this_01,uVar5);
  uVar3 = Query::label(in_RSI);
  this_02 = in_RDI + 3;
  uVar5 = Query::node_pos(in_RSI);
  pvVar10 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                      ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)this_02,(ulong)uVar5
                      );
  pvVar10->child = uVar3;
  uVar3 = Query::label(in_RSI);
  pvVar10 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                      ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                       (ulong)uVar6);
  pvVar10->sib = uVar3;
  Query::next(this_01,uVar4);
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }